

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::anon_unknown_0::LineBufferTask::execute(LineBufferTask *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  LineBuffer *pLVar5;
  undefined8 xStride;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  Data *pDVar13;
  int iVar14;
  PixelType PVar15;
  pointer puVar16;
  PixelType *pPVar17;
  int y;
  uint uVar18;
  bool bVar19;
  bool bVar20;
  char *readPtr;
  
  pLVar5 = this->_lineBuffer;
  if (pLVar5->uncompressedData == (char *)0x0) {
    pDVar13 = this->_ifd;
    iVar4 = (int)(pDVar13->frameBuffer)._sampleCounts.xStride;
    iVar3 = *(int *)((long)&pLVar5->packedDataSize + 4);
    iVar14 = (int)pLVar5->unpackedDataSize;
    if (iVar4 < iVar14) {
      iVar14 = iVar4;
    }
    if (iVar14 < iVar3) {
      uVar11 = 0;
    }
    else {
      iVar4 = *(int *)((long)&(pDVar13->frameBuffer)._sampleCounts.base + 4);
      lVar10 = (long)(iVar3 - iVar4) + -1;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + *(long *)(*(long *)&pDVar13->lineOrder + 8 + lVar10 * 8);
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar14 - iVar4);
    }
    if ((*(long **)&pLVar5->minY == (long *)0x0) ||
       (uVar11 <= (ulong)(long)(int)pLVar5->packedDataSize)) {
      *(undefined4 *)&pLVar5->compressor = 1;
      pLVar5->uncompressedData = pLVar5->buffer;
    }
    else {
      uVar6 = (**(code **)(**(long **)&pLVar5->minY + 0x18))();
      pLVar5 = this->_lineBuffer;
      *(undefined4 *)&pLVar5->compressor = uVar6;
      uVar6 = (**(code **)(**(long **)&pLVar5->minY + 0x30))
                        (*(long **)&pLVar5->minY,pLVar5->buffer,(int)pLVar5->packedDataSize,
                         *(undefined4 *)((long)&pLVar5->packedDataSize + 4));
      *(undefined4 *)&this->_lineBuffer->packedDataSize = uVar6;
    }
  }
  uVar1 = this->_scanLineMax + 1;
  uVar18 = this->_scanLineMin;
  uVar9 = uVar18 - 1;
  bVar20 = (this->_ifd->frameBuffer)._sampleCounts.type == UINT;
  if (!bVar20) {
    uVar18 = this->_scanLineMax;
    uVar1 = uVar9;
  }
  if (uVar18 != uVar1) {
    do {
      readPtr = this->_lineBuffer->uncompressedData +
                (this->_ifd->lineOffsets).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start
                [(long)(int)uVar18 -
                 (long)*(int *)((long)&(this->_ifd->frameBuffer)._sampleCounts.base + 4)];
      pDVar13 = this->_ifd;
      puVar16 = *(pointer *)&pDVar13->fileIsComplete;
      if ((pDVar13->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start != puVar16) {
        uVar11 = 0;
        uVar12 = 1;
        do {
          uVar9 = *(uint *)((long)puVar16 + uVar11 * 0x38 + 0x24);
          if ((int)uVar18 < 0) {
            if (-1 < (int)uVar9) {
              uVar7 = (uVar9 + ~uVar18) / uVar9;
              goto LAB_001b01d0;
            }
            uVar7 = (~uVar9 - uVar18) / -uVar9;
          }
          else if ((int)uVar9 < 0) {
            uVar7 = uVar18 / -uVar9;
LAB_001b01d0:
            uVar7 = -uVar7;
          }
          else {
            uVar7 = uVar18 / uVar9;
          }
          if (uVar18 == uVar7 * uVar9) {
            pPVar17 = (PixelType *)(puVar16 + uVar11 * 7);
            uVar7 = *(uint *)&(pDVar13->frameBuffer)._sampleCounts.field_0x4;
            PVar15 = pPVar17[8];
            if ((int)uVar7 < 0) {
              if (-1 < (int)PVar15) {
                uVar7 = (~uVar7 + PVar15) / PVar15;
                goto LAB_001b0226;
              }
              uVar7 = (~PVar15 - uVar7) / -PVar15;
            }
            else if ((int)PVar15 < 0) {
              uVar7 = uVar7 / -PVar15;
LAB_001b0226:
              uVar7 = -uVar7;
            }
            else {
              uVar7 = uVar7 / PVar15;
            }
            uVar8 = *(uint *)&(pDVar13->frameBuffer)._sampleCounts.base;
            if ((int)uVar8 < 0) {
              if (-1 < (int)PVar15) {
                uVar8 = ~uVar8 + PVar15;
                goto LAB_001b0264;
              }
              uVar8 = (~PVar15 - uVar8) / -PVar15;
            }
            else if ((int)PVar15 < 0) {
              PVar15 = -PVar15;
LAB_001b0264:
              uVar8 = -(uVar8 / PVar15);
            }
            else {
              uVar8 = uVar8 / PVar15;
            }
            if (*(byte *)((long)pPVar17 + 0x29) == 1) {
              skipChannel(&readPtr,pPVar17[1],(long)(int)((uVar8 - uVar7) + 1));
            }
            else {
              if ((int)uVar18 < 0) {
                if (-1 < (int)uVar9) {
                  uVar2 = uVar9 + ~uVar18;
                  goto LAB_001b02c3;
                }
                uVar9 = (~uVar9 - uVar18) / -uVar9;
              }
              else if ((int)uVar9 < 0) {
                uVar9 = -uVar9;
                uVar2 = uVar18;
LAB_001b02c3:
                uVar9 = -(uVar2 / uVar9);
              }
              else {
                uVar9 = uVar18 / uVar9;
              }
              lVar10 = (long)(int)uVar9 * *(undefined8 *)(pPVar17 + 6) +
                       *(undefined8 *)(pPVar17 + 2);
              xStride = *(undefined8 *)(pPVar17 + 4);
              copyIntoFrameBuffer(&readPtr,(char *)((long)(int)uVar7 * xStride + lVar10),
                                  (char *)((long)(int)uVar8 * xStride + lVar10),xStride,
                                  SUB41(pPVar17[10],0),*(double *)(pPVar17 + 0xc),
                                  *(Format *)&this->_lineBuffer->compressor,*pPVar17,pPVar17[1]);
            }
          }
          pDVar13 = this->_ifd;
          puVar16 = *(pointer *)&pDVar13->fileIsComplete;
          uVar11 = ((long)(pDVar13->bytesPerLine).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)puVar16 >> 3) *
                   0x6db6db6db6db6db7;
          bVar19 = uVar12 <= uVar11;
          lVar10 = uVar11 - uVar12;
          uVar11 = uVar12;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (bVar19 && lVar10 != 0);
      }
      uVar18 = uVar18 + (uint)bVar20 * 2 + -1;
    } while (uVar18 != uVar1);
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // Uncompress the data, if necessary
        //

        if (_lineBuffer->uncompressedData == 0)
        {
            uint64_t uncompressedSize = 0;
            int      maxY             = min (_lineBuffer->maxY, _ifd->maxY);

            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                uncompressedSize += (int) _ifd->bytesPerLine[i];
            }

            //
            // Create the compressor everytime when we want to use it,
            // because we don't know maxBytesPerLine beforehand.
            // (TODO) optimize this. don't do this every time.
            //

            if (_lineBuffer->compressor != 0) delete _lineBuffer->compressor;
            uint64_t maxBytesPerLine = 0;
            for (int i = _lineBuffer->minY - _ifd->minY; i <= maxY - _ifd->minY;
                 ++i)
            {
                if (_ifd->bytesPerLine[i] > maxBytesPerLine)
                    maxBytesPerLine = _ifd->bytesPerLine[i];
            }
            _lineBuffer->compressor = newCompressor (
                _ifd->header.compression (), maxBytesPerLine, _ifd->header);

            if (_lineBuffer->compressor &&
                _lineBuffer->packedDataSize < uncompressedSize)
            {
                _lineBuffer->format = _lineBuffer->compressor->format ();

                _lineBuffer->packedDataSize =
                    _lineBuffer->compressor->uncompress (
                        _lineBuffer->buffer,
                        static_cast<int> (_lineBuffer->packedDataSize),
                        _lineBuffer->minY,
                        _lineBuffer->uncompressedData);

                if (_lineBuffer->unpackedDataSize !=
                    _lineBuffer->packedDataSize)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for decompressed data. Expected "
                            << _lineBuffer->unpackedDataSize << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
            else
            {
                //
                // If the line is uncompressed, it's in XDR format,
                // regardless of the compressor's output format.
                //

                _lineBuffer->format           = Compressor::XDR;
                _lineBuffer->uncompressedData = _lineBuffer->buffer;

                if (_lineBuffer->packedDataSize != maxBytesPerLine)
                {
                    THROW (
                        IEX_NAMESPACE::InputExc,
                        "Incorrect size for uncompressed data. Expected "
                            << maxBytesPerLine << " got "
                            << _lineBuffer->packedDataSize << " bytes");
                }
            }
        }

        int yStart, yStop, dy;

        if (_ifd->lineOrder == INCREASING_Y)
        {
            yStart = _scanLineMin;
            yStop  = _scanLineMax + 1;
            dy     = 1;
        }
        else
        {
            yStart = _scanLineMax;
            yStop  = _scanLineMin - 1;
            dy     = -1;
        }

        for (int y = yStart; y != yStop; y += dy)
        {
            //
            // Convert one scan line's worth of pixel data back
            // from the machine-independent representation, and
            // store the result in the frame buffer.
            //

            const char* readPtr = _lineBuffer->uncompressedData +
                                  _ifd->offsetInLineBuffer[y - _ifd->minY];

            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ifd->slices.size (); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
                // (the scan line contains data only if y % ySampling == 0).
                //

                InSliceInfo& slice = *_ifd->slices[i];

                if (modp (y, slice.ySampling) != 0) continue;

                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //

                //
                // Fill the frame buffer with pixel data.
                //

                if (slice.skip)
                {
                    //
                    // The file contains data for this channel, but
                    // the frame buffer contains no slice for this channel.
                    //

                    skipChannel (
                        readPtr,
                        slice.typeInFile,
                        _ifd->lineSampleCount[y - _ifd->minY]);
                }
                else
                {
                    //
                    // The frame buffer contains a slice for this channel.
                    //

                    int width = (_ifd->maxX - _ifd->minX + 1);

                    ptrdiff_t base;

                    if (_ifd->bigFile)
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_lineBuffer->_tempCountBuffer[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_lineBuffer->minY) *
                                static_cast<ptrdiff_t> (width);
                    }
                    else
                    {
                        base = reinterpret_cast<ptrdiff_t> (
                            &_ifd->sampleCount[0][0]);
                        base -= sizeof (unsigned int) * _ifd->minX;
                        base -= sizeof (unsigned int) *
                                static_cast<ptrdiff_t> (_ifd->minY) *
                                static_cast<ptrdiff_t> (width);
                    }

                    copyIntoDeepFrameBuffer (
                        readPtr,
                        slice.base,
                        reinterpret_cast<char*> (base),
                        sizeof (unsigned int) * 1,
                        sizeof (unsigned int) * width,
                        y,
                        _ifd->minX,
                        _ifd->maxX,
                        0,
                        0,
                        0,
                        0,
                        slice.sampleStride,
                        slice.xPointerStride,
                        slice.yPointerStride,
                        slice.fill,
                        slice.fillValue,
                        _lineBuffer->format,
                        slice.typeInFrameBuffer,
                        slice.typeInFile);
                }
            }
        }
    }
    catch (std::exception& e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception    = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}